

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport.c
# Opt level: O0

int decrypt(EVP_PKEY_CTX *ctx,uchar *out,size_t *outlen,uchar *in,size_t inlen)

{
  int iVar1;
  int iVar2;
  int blocksize;
  transportpacket *p;
  size_t *psStack_28;
  int len_local;
  uchar *dest_local;
  uchar *source_local;
  LIBSSH2_SESSION *session_local;
  
  p._4_4_ = (int)in;
  iVar1 = *(int *)(*(long *)(ctx + 0x100) + 8);
  psStack_28 = outlen;
  dest_local = out;
  if (p._4_4_ % iVar1 != 0) {
    __assert_fail("(len % blocksize) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/u35s[P]xtools/thirdparty/libssh2/src/transport.c"
                  ,0x8b,"int decrypt(LIBSSH2_SESSION *, unsigned char *, unsigned char *, int)");
  }
  while( true ) {
    if (p._4_4_ < iVar1) {
      return 0;
    }
    iVar2 = (**(code **)(*(long *)(ctx + 0x100) + 0x28))(ctx,dest_local,(long)iVar1,ctx + 0x108);
    if (iVar2 != 0) break;
    memcpy(psStack_28,dest_local,(long)iVar1);
    p._4_4_ = p._4_4_ - iVar1;
    psStack_28 = (size_t *)((long)psStack_28 + (long)iVar1);
    dest_local = dest_local + iVar1;
  }
  (**(code **)(ctx + 0x18))(*(undefined8 *)(ctx + 0x4250),ctx);
  return -0xc;
}

Assistant:

static int
decrypt(LIBSSH2_SESSION * session, unsigned char *source,
        unsigned char *dest, int len)
{
    struct transportpacket *p = &session->packet;
    int blocksize = session->remote.crypt->blocksize;

    /* if we get called with a len that isn't an even number of blocksizes
       we risk losing those extra bytes */
    assert((len % blocksize) == 0);

    while (len >= blocksize) {
        if (session->remote.crypt->crypt(session, source, blocksize,
                                         &session->remote.crypt_abstract)) {
            LIBSSH2_FREE(session, p->payload);
            return LIBSSH2_ERROR_DECRYPT;
        }

        /* if the crypt() function would write to a given address it
           wouldn't have to memcpy() and we could avoid this memcpy()
           too */
        memcpy(dest, source, blocksize);

        len -= blocksize;       /* less bytes left */
        dest += blocksize;      /* advance write pointer */
        source += blocksize;    /* advance read pointer */
    }
    return LIBSSH2_ERROR_NONE;         /* all is fine */
}